

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuadrature.cpp
# Opt level: O2

void __thiscall chrono::ChQuadratureTables::PrintTables(ChQuadratureTables *this)

{
  pointer pvVar1;
  pointer pdVar2;
  long lVar3;
  uint uVar4;
  ChLog *pCVar5;
  ChStreamOutAscii *pCVar6;
  uint unVal;
  ulong uVar7;
  
  pCVar5 = GetLog();
  ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,"PrintTables: \n\n");
  unVal = 0;
  while( true ) {
    uVar7 = (ulong)unVal;
    if ((ulong)(((long)(this->Lroots).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->Lroots).
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar7) break;
    pCVar5 = GetLog();
    pCVar6 = ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,"\nOrder: ");
    pvVar1 = (this->Lroots).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pCVar6 = ChStreamOutAscii::operator<<
                       (pCVar6,(long)*(pointer *)
                                      ((long)&pvVar1[uVar7].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data + 8) -
                               *(long *)&pvVar1[uVar7].
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data >> 3);
    pCVar6 = ChStreamOutAscii::operator<<(pCVar6,"  at table n.");
    pCVar6 = ChStreamOutAscii::operator<<(pCVar6,unVal);
    ChStreamOutAscii::operator<<(pCVar6," with roots&weights: \n");
    uVar4 = 0;
    while( true ) {
      pvVar1 = (this->Lroots).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar2 = *(pointer *)
                ((long)&pvVar1[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + 8);
      lVar3 = *(long *)&pvVar1[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      pCVar5 = GetLog();
      if ((ulong)((long)pdVar2 - lVar3 >> 3) <= (ulong)uVar4) break;
      pCVar6 = ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,"  ");
      ChStreamOutAscii::operator<<
                (pCVar6,*(double *)
                         (*(long *)&(this->Lroots).
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data + (ulong)uVar4 * 8));
      uVar4 = uVar4 + 1;
    }
    ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,"\n");
    for (uVar4 = 0;
        pvVar1 = (this->Weight).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        (ulong)uVar4 <
        (ulong)((long)*(pointer *)
                       ((long)&pvVar1[uVar7].super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl + 8) -
                *(long *)&pvVar1[uVar7].super__Vector_base<double,_std::allocator<double>_>._M_impl
               >> 3); uVar4 = uVar4 + 1) {
      pCVar5 = GetLog();
      pCVar6 = ChStreamOutAscii::operator<<(&pCVar5->super_ChStreamOutAscii,"  ");
      ChStreamOutAscii::operator<<
                (pCVar6,*(double *)
                         (*(long *)&(this->Weight).
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar7].
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl +
                         (ulong)uVar4 * 8));
    }
    unVal = unVal + 1;
  }
  return;
}

Assistant:

void ChQuadratureTables::PrintTables() {
    GetLog() << "PrintTables: \n\n";

    for (unsigned int io = 0; io < Lroots.size(); ++io) {
        GetLog() << "\nOrder: " << Lroots[io].size() << "  at table n." << io << " with roots&weights: \n";
        for (unsigned int ir = 0; ir < Lroots[io].size(); ++ir)
            GetLog() << "  " << Lroots[io][ir];
        GetLog() << "\n";
        for (unsigned int ir = 0; ir < Weight[io].size(); ++ir)
            GetLog() << "  " << Weight[io][ir];
    }
}